

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O3

PixelColor color_from_gradient_range(GradientColor *left,GradientColor *right,float pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (pos - left->pos) / (right->pos - left->pos);
  fVar1 = std::__lerp<float>(left->r,right->r,fVar3);
  fVar2 = std::__lerp<float>(left->g,right->g,fVar3);
  fVar3 = std::__lerp<float>(left->b,right->b,fVar3);
  return (PixelColor)
         ((uint3)(int)(fVar1 * 255.0) & 0xff |
         (uint3)(((int)(fVar2 * 255.0) & 0xffU) << 8) | (uint3)((int)(fVar3 * 255.0) << 0x10));
}

Assistant:

PixelColor color_from_gradient_range(const GradientColor& left, const GradientColor& right, const float pos) noexcept
{
    const float relative_pos_between_colors = (pos - left.pos) / (right.pos - left.pos);
    return PixelColor{static_cast<unsigned char>(255.0f * std::lerp(left.r, right.r, relative_pos_between_colors)),
                      static_cast<unsigned char>(255.0f * std::lerp(left.g, right.g, relative_pos_between_colors)),
                      static_cast<unsigned char>(255.0f * std::lerp(left.b, right.b, relative_pos_between_colors))};
}